

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupSliced(Gia_Man_t *p,int nSuppMax)

{
  uint uVar1;
  int iLit1;
  Gia_Man_t *pGVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int iVar6;
  int local_3c;
  Gia_Man_t *local_38;
  
  pGVar2 = Gia_ManStart(5000);
  pcVar3 = Abc_UtilStrsav(p->pName);
  pGVar2->pName = pcVar3;
  p->pObjs->Value = 0;
  for (iVar6 = 0; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCi(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(pGVar2);
    pGVar4->Value = uVar1;
  }
  local_38 = pGVar2;
  Gia_ManCleanMark01(p);
  for (local_3c = 0; local_3c < p->nObjs; local_3c = local_3c + 1) {
    pGVar4 = Gia_ManObj(p,local_3c);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar6 = Gia_ManSuppSize(p,&local_3c,1);
      if (nSuppMax < iVar6) {
        *(ulong *)(pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff)) =
             *(ulong *)(pGVar4 + -(*(ulong *)pGVar4 & 0x1fffffff)) | 0x4000000000000000;
        pGVar4 = pGVar4 + -((ulong)*(uint *)&pGVar4->field_0x4 & 0x1fffffff);
        uVar5 = 0x4000000000000000;
      }
      else {
        iVar6 = Gia_ObjFanin0Copy(pGVar4);
        iLit1 = Gia_ObjFanin1Copy(pGVar4);
        uVar1 = Gia_ManAppendAnd(local_38,iVar6,iLit1);
        pGVar4->Value = uVar1;
        uVar5 = 0x40000000;
      }
      *(ulong *)pGVar4 = *(ulong *)pGVar4 | uVar5;
    }
  }
  pGVar2 = local_38;
  for (local_3c = 0; local_3c < p->vCos->nSize; local_3c = local_3c + 1) {
    pGVar4 = Gia_ManCo(p,local_3c);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    *(ulong *)(pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)) =
         *(ulong *)(pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)) |
         0x4000000000000000;
  }
  for (local_3c = 0; local_3c < p->nObjs; local_3c = local_3c + 1) {
    pGVar4 = Gia_ManObj(p,local_3c);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((*(ulong *)pGVar4 & 0x40000000c0000000) == 0x4000000040000000 &&
        (~(uint)*(ulong *)pGVar4 & 0x1fffffff) != 0) {
      Gia_ManAppendCo(pGVar2,pGVar4->Value);
    }
  }
  Gia_ManCleanMark01(p);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManDupSliced( Gia_Man_t * p, int nSuppMax )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    // create constant and PIs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Gia_ManCleanMark01(p);
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ManSuppSize(p, &i, 1) <= nSuppMax )
        {
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            pObj->fMark0 = 1;
        }
        else 
        {
            Gia_ObjFanin0(pObj)->fMark1 = 1;
            Gia_ObjFanin1(pObj)->fMark1 = 1;
        }
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjFanin0(pObj)->fMark1 = 1;
    // add POs for the nodes pointed to
    Gia_ManForEachAnd( p, pObj, i )
        if ( pObj->fMark0 && pObj->fMark1 )
            Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup and leave
    Gia_ManCleanMark01(p);
    return pNew;
}